

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O0

void __thiscall HenyeyGreenstein_g_Test::TestBody(HenyeyGreenstein_g_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  float fVar4;
  Float FVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Vector3f VVar10;
  AssertionResult gtest_ar;
  Float gEst;
  Vector3f wi;
  Point2f u;
  Stratified2DIter __end2;
  Stratified2DIter __begin2;
  Stratified2D *__range2;
  int nSamples;
  int sqrtSamples;
  Float sum;
  Vector3f wo;
  HGPhaseFunction hg;
  float g;
  RNG rng;
  Stratified2DIter *in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  float fVar11;
  AssertionResult *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  Float in_stack_fffffffffffffec4;
  Stratified2DIter *this_00;
  int line;
  undefined4 in_stack_fffffffffffffed0;
  undefined1 *puVar12;
  Type type;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertionResult local_100;
  float local_ec;
  undefined8 local_e8;
  float local_e0;
  undefined4 in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  IndexingIterator<pbrt::detail::Stratified2DIter> local_a0 [4];
  undefined1 local_80 [16];
  double in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  undefined1 *val1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar13;
  float fVar14;
  char *expr1;
  undefined1 local_34 [8];
  char *local_2c;
  float local_24;
  HGPhaseFunction local_20;
  float local_1c;
  undefined1 auVar9 [56];
  undefined1 extraout_var [56];
  
  pbrt::RNG::RNG((RNG *)&stack0xffffffffffffffe8);
  for (local_1c = -0.75; local_1c <= 0.75; local_1c = local_1c + 0.25) {
    pbrt::HGPhaseFunction::HGPhaseFunction(&local_20,local_1c);
    this_00 = (Stratified2DIter *)&stack0xffffffffffffffe8;
    fVar4 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    pbrt::RNG::Uniform<float>((RNG *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    auVar9 = (undefined1  [56])0x0;
    puVar12 = local_34;
    pbrt::Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (float)((ulong)in_stack_fffffffffffffea8 >> 0x20),SUB84(in_stack_fffffffffffffea8,0))
    ;
    VVar10 = pbrt::SampleUniformSphere((Point2f *)CONCAT44(fVar4,in_stack_fffffffffffffed0));
    local_24 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar9;
    expr1 = (char *)vmovlpd_avx(auVar6._0_16_);
    fVar14 = 0.0;
    uVar13 = 0x40;
    iVar3 = 0x1000;
    local_2c = expr1;
    pbrt::Stratified2D::Stratified2D
              ((Stratified2D *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (uint64_t)in_stack_fffffffffffffea8);
    val1 = local_80;
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::begin
              ((IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::end
              ((IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    fVar11 = in_stack_fffffffffffffeb4;
    in_stack_fffffffffffffeb4 = fVar14;
    while( true ) {
      bVar2 = pbrt::detail::IndexingIterator<pbrt::detail::Stratified2DIter>::operator!=
                        ((IndexingIterator<pbrt::detail::Stratified2DIter> *)
                         CONCAT44(fVar11,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8);
      type = (Type)((ulong)puVar12 >> 0x20);
      if (!bVar2) break;
      auVar7._0_8_ = pbrt::detail::Stratified2DIter::operator*(this_00);
      auVar7._8_56_ = extraout_var;
      vmovlpd_avx(auVar7._0_16_);
      auVar9 = extraout_var;
      VVar10 = pbrt::SampleUniformSphere((Point2f *)CONCAT44(fVar4,in_stack_fffffffffffffed0));
      local_e0 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar9;
      local_e8 = vmovlpd_avx(auVar8._0_16_);
      in_stack_ffffffffffffff2c = (float)local_e8;
      in_stack_ffffffffffffff30 = (float)((ulong)local_e8 >> 0x20);
      in_stack_ffffffffffffff34 = local_e0;
      in_stack_fffffffffffffec4 =
           pbrt::HGPhaseFunction::p
                     ((HGPhaseFunction *)
                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (Vector3f *)in_stack_fffffffffffffeb8,
                      (Vector3f *)CONCAT44(fVar11,in_stack_fffffffffffffeb0));
      fVar14 = pbrt::Dot<float>((Vector3<float> *)&local_2c,
                                (Vector3<float> *)&stack0xffffffffffffff2c);
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)-fVar14),ZEXT416((uint)in_stack_fffffffffffffec4),
                               ZEXT416((uint)in_stack_fffffffffffffeb4));
      in_stack_fffffffffffffeb4 = auVar1._0_4_;
      pbrt::detail::IndexingIterator<pbrt::detail::Stratified2DIter>::operator++(local_a0);
    }
    in_stack_fffffffffffffeb0 = (float)iVar3;
    fVar11 = in_stack_fffffffffffffeb4;
    FVar5 = pbrt::UniformSpherePDF();
    line = (int)((ulong)this_00 >> 0x20);
    local_ec = in_stack_fffffffffffffeb4 / (in_stack_fffffffffffffeb0 * FVar5);
    in_stack_fffffffffffffeb8 = &local_100;
    testing::internal::DoubleNearPredFormat
              (expr1,(char *)CONCAT44(fVar11,uVar13),
               (char *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),(double)val1,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffec0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffec0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffee0);
      in_stack_fffffffffffffea8 =
           (Stratified2DIter *)
           testing::AssertionResult::failure_message((AssertionResult *)0x54c890);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffee0,type,(char *)CONCAT44(fVar4,in_stack_fffffffffffffed0),
                 line,(char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      testing::Message::~Message((Message *)0x54c8dc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x54c91c);
  }
  return;
}

Assistant:

TEST(HenyeyGreenstein, g) {
    RNG rng;
    for (float g = -.75; g <= 0.75; g += 0.25) {
        HGPhaseFunction hg(g);
        Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Float sum = 0;
        int sqrtSamples = 64;
        int nSamples = sqrtSamples * sqrtSamples;
        for (Point2f u : Stratified2D(sqrtSamples, sqrtSamples)) {
            Vector3f wi = SampleUniformSphere(u);
            // Negate dot to match direction convention
            sum += hg.p(wo, wi) * -Dot(wo, wi);
        }
        Float gEst = sum / (nSamples * UniformSpherePDF());
        EXPECT_NEAR(g, gEst, .01);
    }
}